

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

void __thiscall CFG::eliminateNonGeneratingSymbols(CFG *this)

{
  pointer pbVar1;
  pointer ppPVar2;
  bool bVar3;
  ostream *poVar4;
  ulong uVar5;
  char *this_00;
  CFG *this_01;
  int iVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  generatingSymbols;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_b8,&this->terminalsT);
  do {
    bVar3 = expandGeneratingSymbols(this,&local_b8);
  } while (bVar3);
  this_00 = "Generating symbols: ";
  poVar4 = std::operator<<((ostream *)&std::cout,"Generating symbols: ");
  vecToStr(&local_a0,(CFG *)this_00,&local_b8);
  poVar4 = std::operator<<(poVar4,(string *)&local_a0);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_a0);
  iVar6 = 0;
  while( true ) {
    uVar5 = (ulong)iVar6;
    pbVar1 = (this->nonTerminalsV).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->nonTerminalsV).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar5)
    break;
    std::__cxx11::string::string((string *)&local_50,(string *)(pbVar1 + uVar5));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_68,&local_b8);
    bVar3 = inVector(&local_50,&local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&this->nonTerminalsV,
              (this->nonTerminalsV).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar5);
      iVar6 = iVar6 + -1;
    }
    iVar6 = iVar6 + 1;
  }
  iVar6 = 0;
  while( true ) {
    uVar5 = (ulong)iVar6;
    ppPVar2 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->productionsP).
                      super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppPVar2 >> 3) <= uVar5) break;
    this_01 = (CFG *)&stack0xffffffffffffff80;
    vectorUnion((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xffffffffffffff80,&this->terminalsT,&local_b8);
    bVar3 = reachableProduction(this_01,ppPVar2 + uVar5,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&stack0xffffffffffffff80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xffffffffffffff80);
    if (!bVar3) {
      std::vector<Production_*,_std::allocator<Production_*>_>::erase
                (&this->productionsP,
                 (const_iterator)
                 ((this->productionsP).
                  super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar5));
      iVar6 = iVar6 + -1;
    }
    iVar6 = iVar6 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void CFG::eliminateNonGeneratingSymbols() {
    // Find all generating symbols (and thus also the nongenerating)
    std::vector<std::string> generatingSymbols = terminalsT;

    while (expandGeneratingSymbols(generatingSymbols)) {}

    std::cout << "Generating symbols: " << vecToStr(generatingSymbols) << std::endl;

    // Remove all non-generating symbols from variables, (terminals) and productions
    for (int i = 0; i < nonTerminalsV.size(); ++i) {
        if (!inVector(nonTerminalsV[i], generatingSymbols)) {
            nonTerminalsV.erase(nonTerminalsV.begin() + i);
            --i;
        }
    }

    for (int j = 0; j < productionsP.size(); ++j) {
        if (!reachableProduction(productionsP[j], vectorUnion(terminalsT, generatingSymbols))) {
            productionsP.erase(productionsP.begin() + j);
            --j;
        }
    }

}